

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Stack::getSelfBinding(Stack *this,HeapObject **self,uint *offset)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  uint *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int i;
  int local_1c;
  
  *in_RSI = 0;
  *in_RDX = 0;
  sVar2 = std::
          vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ::size((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                  *)(in_RDI + 0x10));
  local_1c = (int)sVar2;
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return;
    }
    pvVar3 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                           *)(in_RDI + 0x10),(long)local_1c);
    bVar1 = Frame::isCall(pvVar3);
  } while (!bVar1);
  pvVar3 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                         *)(in_RDI + 0x10),(long)local_1c);
  *in_RSI = pvVar3->self;
  pvVar3 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                         *)(in_RDI + 0x10),(long)local_1c);
  *in_RDX = pvVar3->offset;
  return;
}

Assistant:

void getSelfBinding(HeapObject *&self, unsigned &offset)
    {
        self = nullptr;
        offset = 0;
        for (int i = stack.size() - 1; i >= 0; --i) {
            if (stack[i].isCall()) {
                self = stack[i].self;
                offset = stack[i].offset;
                return;
            }
        }
    }